

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathLangFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  byte *pbVar1;
  int iVar2;
  long lVar3;
  __int32_t **pp_Var4;
  xmlXPathObjectPtr pxVar5;
  byte bVar6;
  uint val;
  xmlNodePtr node;
  xmlChar *theLang;
  xmlChar *local_40;
  xmlXPathObjectPtr local_38;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueNr < 1) {
      iVar2 = 0x17;
    }
    else {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_STRING)) {
        iVar2 = ctxt->valueNr;
        lVar3 = (long)iVar2;
        if (lVar3 < 1) {
          local_38 = (xmlXPathObjectPtr)0x0;
        }
        else {
          ctxt->valueNr = iVar2 + -1;
          if (iVar2 == 1) {
            pxVar5 = (xmlXPathObjectPtr)0x0;
          }
          else {
            pxVar5 = ctxt->valueTab[lVar3 + -2];
          }
          ctxt->value = pxVar5;
          local_38 = ctxt->valueTab[lVar3 + -1];
          ctxt->valueTab[lVar3 + -1] = (xmlXPathObjectPtr)0x0;
        }
        pbVar1 = local_38->stringval;
        node = ctxt->context->node;
        if (node != (xmlNodePtr)0x0) {
          do {
            iVar2 = xmlNodeGetAttrValue(node,"lang",
                                        (xmlChar *)"http://www.w3.org/XML/1998/namespace",&local_40)
            ;
            if (iVar2 < 0) {
              xmlXPathPErrMemory(ctxt);
            }
          } while ((local_40 == (xmlChar *)0x0) && (node = node->parent, node != (_xmlNode *)0x0));
        }
        val = 0;
        if ((local_40 != (xmlChar *)0x0) && (val = 0, pbVar1 != (byte *)0x0)) {
          bVar6 = *pbVar1;
          if (bVar6 == 0) {
            lVar3 = 0;
          }
          else {
            pp_Var4 = __ctype_toupper_loc();
            val = 0;
            lVar3 = 0;
            do {
              if ((*pp_Var4)[bVar6] != (*pp_Var4)[local_40[lVar3]]) goto LAB_001c30ba;
              bVar6 = pbVar1[lVar3 + 1];
              lVar3 = lVar3 + 1;
            } while (bVar6 != 0);
          }
          val = (uint)(local_40[lVar3] == '-' || local_40[lVar3] == '\0');
        }
LAB_001c30ba:
        if (local_40 != (xmlChar *)0x0) {
          (*xmlFree)(local_40);
        }
        xmlXPathReleaseObject(ctxt->context,local_38);
        pxVar5 = xmlXPathCacheNewBoolean(ctxt,val);
        xmlXPathValuePush(ctxt,pxVar5);
        return;
      }
      iVar2 = 0xb;
    }
  }
  else {
    iVar2 = 0xc;
  }
  xmlXPathErr(ctxt,iVar2);
  return;
}

Assistant:

void
xmlXPathLangFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr val;
    xmlNodePtr cur;
    xmlChar *theLang;
    const xmlChar *lang;
    int ret = 0;
    int i;

    CHECK_ARITY(1);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    val = xmlXPathValuePop(ctxt);
    lang = val->stringval;
    cur = ctxt->context->node;
    while (cur != NULL) {
        if (xmlNodeGetAttrValue(cur, BAD_CAST "lang", XML_XML_NAMESPACE,
                                &theLang) < 0)
            xmlXPathPErrMemory(ctxt);
        if (theLang != NULL)
            break;
        cur = cur->parent;
    }
    if ((theLang != NULL) && (lang != NULL)) {
        for (i = 0;lang[i] != 0;i++)
            if (toupper(lang[i]) != toupper(theLang[i]))
                goto not_equal;
        if ((theLang[i] == 0) || (theLang[i] == '-'))
            ret = 1;
    }
not_equal:
    if (theLang != NULL)
	xmlFree((void *)theLang);

    xmlXPathReleaseObject(ctxt->context, val);
    xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, ret));
}